

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void printInDevices(void)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  char *__s1;
  char *pcVar2;
  char *type;
  char *desc;
  char *name;
  char **n;
  char *pcStack_10;
  int err;
  char **hints;
  
  iVar1 = snd_device_name_hint(0,"pcm",&stack0xfffffffffffffff0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Can\'t read data\n");
    exit(1);
  }
  for (name = pcStack_10; *(long *)name != 0; name = name + 8) {
    __ptr = (void *)snd_device_name_get_hint(*(undefined8 *)name,"NAME");
    __ptr_00 = (void *)snd_device_name_get_hint(*(undefined8 *)name,"DESC");
    __s1 = (char *)snd_device_name_get_hint(*(undefined8 *)name,"IOID");
    if (((__ptr != (void *)0x0) && (__ptr_00 != (void *)0x0)) &&
       ((__s1 == (char *)0x0 || (iVar1 = strcmp(__s1,"Input"), iVar1 == 0)))) {
      pcVar2 = "Input";
      if (__s1 == (char *)0x0) {
        pcVar2 = "Input/Output";
      }
      printf("%s\n%s: <%s>\n\n",__ptr_00,pcVar2,__ptr);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
      free(__ptr_00);
      free(__s1);
    }
  }
  snd_device_name_free_hint(pcStack_10);
  snd_config_update_free_global();
  return;
}

Assistant:

void printInDevices() {
    char **hints;
    /* Enumerate sound devices */
    int err = snd_device_name_hint(0, "pcm", (void***)&hints);
    if (err != 0) {
        fprintf(stderr, "Can't read data\n");
        exit(EXIT_FAILURE);
    }

    char** n = hints;
    while (*n != NULL) {
        char *name = snd_device_name_get_hint(*n, "NAME");
        char *desc = snd_device_name_get_hint(*n, "DESC");
        char *type = snd_device_name_get_hint(*n, "IOID");
        if (name != NULL && desc != NULL) {
            if (type == NULL || !strcmp(type, "Input")) {
                printf("%s\n%s: <%s>\n\n", desc, type == NULL ? "Input/Output" : "Input",name);
            }
        }
        if (name != NULL) free(name);
        if (name != NULL) free(desc);
        if (name != NULL) free(type);
        n++;
    }

    //Free hint buffer too
    snd_device_name_free_hint((void**)hints);
    snd_config_update_free_global();
}